

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::handle_ext_resp(raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  rpc_exception *err_00;
  element_type *peVar1;
  element_type *peVar2;
  resp_msg *resp_00;
  int iVar3;
  uint uVar4;
  msg_type type;
  msg_type type_00;
  unique_lock<std::recursive_mutex> guard;
  string local_70;
  string local_50;
  unique_lock<std::recursive_mutex> local_30;
  
  local_30._M_device = &this->lock_;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  local_30._M_owns = true;
  err_00 = (err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (err_00 == (rpc_exception *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 4 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_70,"type: %d, err %p\n",
                 (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_msg_base).type_,
                 (err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      (*peVar1->_vptr_logger[8])
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_ext_resp",0x58b,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 4 < iVar3)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_type_to_string_abi_cxx11_
                (&local_50,
                 (nuraft *)
                 (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_msg_base).type_,type);
      peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_70,
                 "Receive an extended %s message from peer %d with Result=%d, Term=%lu, NextIndex=%lu"
                 ,local_50._M_dataplus._M_p,(ulong)(uint)(peVar2->super_msg_base).src_,
                 (ulong)peVar2->accepted_,(peVar2->super_msg_base).term_,peVar2->next_idx_);
      (*peVar1->_vptr_logger[8])
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_ext_resp",0x593,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    resp_00 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar4 = (resp_00->super_msg_base).type_ - sync_log_response;
    switch(uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) {
    case 0:
      handle_log_sync_resp(this,resp_00);
      break;
    case 1:
      handle_join_cluster_resp(this,resp_00);
      break;
    case 2:
      handle_leave_cluster_resp(this,resp_00);
      break;
    case 3:
      handle_install_snapshot_resp_new_member(this,resp_00);
      break;
    default:
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar3 = (*peVar1->_vptr_logger[7])(), 1 < iVar3)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_type_to_string_abi_cxx11_
                  (&local_50,
                   (nuraft *)
                   (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->super_msg_base).type_,type_00);
        msg_if_given_abi_cxx11_
                  (&local_70,"received an unexpected response message type %s",
                   local_50._M_dataplus._M_p);
        (*peVar1->_vptr_logger[8])
                  (peVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_ext_resp",0x5ad,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      break;
    case 8:
      handle_reconnect_resp(this,resp_00);
    }
  }
  else {
    handle_ext_resp_err(this,err_00);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void raft_server::handle_ext_resp(ptr<resp_msg>& resp, ptr<rpc_exception>& err) {
    recur_lock(lock_);
    if (err) {
        handle_ext_resp_err(*err);
        return;
    }
    p_db("type: %d, err %p\n", (int)resp->get_type(), err.get());

    p_db( "Receive an extended %s message from peer %d with Result=%d, "
          "Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
          msg_type_to_string(resp->get_type()).c_str(),
          resp->get_src(),
          resp->get_accepted() ? 1 : 0,
          resp->get_term(),
          resp->get_next_idx() );

    switch (resp->get_type())
    {
    case msg_type::sync_log_response:
        handle_log_sync_resp(*resp);
        break;

    case msg_type::join_cluster_response:
        handle_join_cluster_resp(*resp);
        break;

    case msg_type::leave_cluster_response:
        handle_leave_cluster_resp(*resp);
        break;

    case msg_type::install_snapshot_response:
        handle_install_snapshot_resp_new_member(*resp);
        break;

    case msg_type::reconnect_response:
        handle_reconnect_resp(*resp);
        break;

    default:
        p_er( "received an unexpected response message type %s",
              msg_type_to_string(resp->get_type()).c_str() );
        break;
    }
}